

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

InstructionFolder * __thiscall spvtools::opt::IRContext::get_instruction_folder(IRContext *this)

{
  InstructionFolder *__ptr;
  InstructionFolder *this_00;
  pointer __p;
  InstructionFolder *local_20;
  
  if ((this->inst_folder_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
      .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl ==
      (InstructionFolder *)0x0) {
    this_00 = (InstructionFolder *)operator_new(0x18);
    InstructionFolder::InstructionFolder(this_00,this);
    local_20 = (InstructionFolder *)0x0;
    __ptr = (this->inst_folder_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
            .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl;
    (this->inst_folder_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
    .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl = this_00;
    if (__ptr != (InstructionFolder *)0x0) {
      std::default_delete<spvtools::opt::InstructionFolder>::operator()
                ((default_delete<spvtools::opt::InstructionFolder> *)&this->inst_folder_,__ptr);
    }
    if (local_20 != (InstructionFolder *)0x0) {
      std::default_delete<spvtools::opt::InstructionFolder>::operator()
                ((default_delete<spvtools::opt::InstructionFolder> *)&local_20,local_20);
    }
  }
  return (this->inst_folder_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
         .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl;
}

Assistant:

const InstructionFolder& get_instruction_folder() {
    if (!inst_folder_) {
      inst_folder_ = MakeUnique<InstructionFolder>(this);
    }
    return *inst_folder_;
  }